

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary.cc
# Opt level: O3

void __thiscall fasttext::Dictionary::prune(Dictionary *this,vector<int,_std::allocator<int>_> *idx)

{
  vector<fasttext::entry,_std::allocator<fasttext::entry>_> *this_00;
  char *pcVar1;
  pointer peVar2;
  _Alloc_hider _Var3;
  size_type sVar4;
  pointer piVar5;
  entry_type eVar6;
  int32_t iVar7;
  mapped_type *pmVar8;
  size_type sVar9;
  pointer peVar10;
  uint32_t h;
  pointer *ppiVar11;
  ulong uVar12;
  long lVar13;
  long lVar14;
  pointer piVar15;
  iterator __position;
  vector<int,std::allocator<int>> *pvVar16;
  iterator __begin2;
  int *piVar17;
  int32_t j;
  int iVar18;
  pointer piVar19;
  ulong uVar20;
  string_view w;
  vector<int,_std::allocator<int>_> words;
  vector<int,_std::allocator<int>_> ngrams;
  vector<int,_std::allocator<int>_> local_78;
  vector<int,std::allocator<int>> *local_60;
  int *local_58;
  pointer piStack_50;
  int *local_48;
  int local_34;
  
  local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (int *)0x0;
  local_48 = (int *)0x0;
  local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (int *)0x0;
  local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (int *)0x0;
  local_58 = (int *)0x0;
  piStack_50 = (int *)0x0;
  piVar19 = (idx->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
            _M_start;
  if (piVar19 !=
      (idx->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_finish
     ) {
    do {
      if (*piVar19 < this->nwords_) {
        ppiVar11 = &local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish;
        __position._M_current =
             local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_finish;
        piVar15 = local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish;
        pvVar16 = (vector<int,std::allocator<int>> *)&local_78;
        if (local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish ==
            local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_end_of_storage) goto LAB_00127cbe;
LAB_00127c9f:
        *piVar15 = *piVar19;
        *ppiVar11 = piVar15 + 1;
      }
      else {
        ppiVar11 = &piStack_50;
        __position._M_current = piStack_50;
        piVar15 = piStack_50;
        pvVar16 = (vector<int,std::allocator<int>> *)&local_58;
        if (piStack_50 != local_48) goto LAB_00127c9f;
LAB_00127cbe:
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                  (pvVar16,__position,piVar19);
      }
      piVar5 = local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish;
      piVar15 = local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
      piVar19 = piVar19 + 1;
    } while (piVar19 !=
             (idx->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
             _M_finish);
    if (local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start !=
        local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish) {
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                (local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start,
                 local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish,
                 (int)LZCOUNT((long)local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_finish -
                              (long)local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_start >> 2) * 2 ^ 0x7e);
      std::
      __final_insertion_sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_less_iter>
                (piVar15,piVar5);
    }
  }
  std::vector<int,_std::allocator<int>_>::operator=(idx,&local_78);
  piVar19 = piStack_50;
  if (piStack_50 != local_58) {
    iVar18 = 0;
    piVar17 = local_58;
    local_60 = (vector<int,std::allocator<int>> *)idx;
    do {
      local_34 = *piVar17 - this->nwords_;
      pmVar8 = std::__detail::
               _Map_base<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)&this->pruneidx_,&local_34);
      *pmVar8 = iVar18;
      iVar18 = iVar18 + 1;
      piVar17 = piVar17 + 1;
    } while (piVar17 != piVar19);
    std::vector<int,std::allocator<int>>::
    _M_range_insert<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
              (local_60,*(undefined8 *)(local_60 + 8),local_58,piStack_50);
  }
  this->pruneidx_size_ = (this->pruneidx_)._M_h._M_element_count;
  piVar19 = (this->word2int_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start;
  piVar15 = (this->word2int_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (piVar19 != piVar15) {
    memset(piVar19,0xff,((long)piVar15 + (-4 - (long)piVar19) & 0xfffffffffffffffcU) + 4);
  }
  peVar10 = (this->words_).super__Vector_base<fasttext::entry,_std::allocator<fasttext::entry>_>.
            _M_impl.super__Vector_impl_data._M_start;
  this_00 = &this->words_;
  pvVar16 = (vector<int,std::allocator<int>> *)0x0;
  if ((this->words_).super__Vector_base<fasttext::entry,_std::allocator<fasttext::entry>_>._M_impl.
      super__Vector_impl_data._M_finish == peVar10) {
    lVar14 = 0;
  }
  else {
    uVar20 = 0;
    do {
      eVar6 = getType(this,(int32_t)uVar20);
      uVar12 = (ulong)(int)pvVar16;
      if ((eVar6 == label) ||
         ((uVar12 < (ulong)((long)local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_finish -
                            (long)local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start >> 2) &&
          (uVar20 == (uint)local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start[uVar12])))) {
        peVar2 = (this_00->super__Vector_base<fasttext::entry,_std::allocator<fasttext::entry>_>).
                 _M_impl.super__Vector_impl_data._M_start;
        peVar10 = peVar2 + uVar12;
        local_60 = pvVar16;
        std::__cxx11::string::_M_assign((string *)peVar10);
        peVar10->type = peVar2[uVar20].type;
        peVar10->count = peVar2[uVar20].count;
        std::vector<int,_std::allocator<int>_>::operator=
                  (&peVar10->subwords,&peVar2[uVar20].subwords);
        peVar10 = (this_00->super__Vector_base<fasttext::entry,_std::allocator<fasttext::entry>_>).
                  _M_impl.super__Vector_impl_data._M_start;
        h = 0x811c9dc5;
        _Var3._M_p = peVar10[uVar12].word._M_dataplus._M_p;
        sVar4 = peVar10[uVar12].word._M_string_length;
        if (sVar4 != 0) {
          sVar9 = 0;
          do {
            pcVar1 = _Var3._M_p + sVar9;
            sVar9 = sVar9 + 1;
            h = ((int)*pcVar1 ^ h) * 0x1000193;
          } while (sVar4 != sVar9);
        }
        iVar18 = (int)local_60;
        w._M_str = _Var3._M_p;
        w._M_len = sVar4;
        iVar7 = find(this,w,h);
        (this->word2int_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start[iVar7] = iVar18;
        pvVar16 = (vector<int,std::allocator<int>> *)(ulong)(iVar18 + 1);
      }
      peVar10 = (this->words_).super__Vector_base<fasttext::entry,_std::allocator<fasttext::entry>_>
                ._M_impl.super__Vector_impl_data._M_start;
      uVar20 = uVar20 + 1;
      lVar14 = (long)(this->words_).
                     super__Vector_base<fasttext::entry,_std::allocator<fasttext::entry>_>._M_impl.
                     super__Vector_impl_data._M_finish - (long)peVar10;
      uVar12 = (lVar14 >> 3) * -0x71c71c71c71c71c7;
    } while (uVar20 <= uVar12 && uVar12 - uVar20 != 0);
  }
  iVar18 = (int)((ulong)((long)local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_finish -
                        (long)local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start) >> 2);
  this->nwords_ = iVar18;
  lVar13 = (long)iVar18 + (long)this->nlabels_;
  this->size_ = (int32_t)lVar13;
  std::vector<fasttext::entry,_std::allocator<fasttext::entry>_>::_M_erase
            (this_00,peVar10 + lVar13,(entry *)((long)&(peVar10->word)._M_dataplus._M_p + lVar14));
  initNgrams(this);
  if (local_58 != (int *)0x0) {
    operator_delete(local_58,(long)local_48 - (long)local_58);
  }
  if (local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void Dictionary::prune(std::vector<int32_t>& idx) {
  std::vector<int32_t> words, ngrams;
  for (auto it = idx.cbegin(); it != idx.cend(); ++it) {
    if (*it < nwords_) {
      words.push_back(*it);
    } else {
      ngrams.push_back(*it);
    }
  }
  std::sort(words.begin(), words.end());
  idx = words;

  if (ngrams.size() != 0) {
    int32_t j = 0;
    for (const auto ngram : ngrams) {
      pruneidx_[ngram - nwords_] = j;
      j++;
    }
    idx.insert(idx.end(), ngrams.begin(), ngrams.end());
  }
  pruneidx_size_ = pruneidx_.size();

  std::fill(word2int_.begin(), word2int_.end(), -1);

  int32_t j = 0;
  for (int32_t i = 0; i < words_.size(); i++) {
    if (getType(i) == entry_type::label ||
        (j < words.size() && words[j] == i)) {
      words_[j] = words_[i];
      word2int_[find(words_[j].word)] = j;
      j++;
    }
  }
  nwords_ = words.size();
  size_ = nwords_ + nlabels_;
  words_.erase(words_.begin() + size_, words_.end());
  initNgrams();
}